

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::SplitLayerParams::~SplitLayerParams(SplitLayerParams *this)

{
  SplitLayerParams *this_local;
  
  ~SplitLayerParams(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

SplitLayerParams::~SplitLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.SplitLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}